

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O2

void __thiscall
QAbstractScrollAreaPrivate::layoutChildren_helper
          (QAbstractScrollAreaPrivate *this,bool *needHorizontalScrollbar,
          bool *needVerticalScrollbar)

{
  ScrollBarPolicy SVar1;
  long lVar2;
  QWidget *widget;
  QWidget *pQVar3;
  QHeaderView *this_00;
  QAbstractScrollAreaScrollBarContainer *pQVar4;
  undefined1 auVar5 [12];
  QHeaderView **ppQVar6;
  Representation RVar7;
  LayoutDirection direction;
  byte bVar8;
  byte bVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  Representation RVar18;
  Orientation OVar19;
  QStyle *pQVar20;
  int extraout_var;
  ulong uVar21;
  bool bVar22;
  Representation RVar23;
  long lVar24;
  undefined8 uVar25;
  undefined8 *puVar26;
  QRect *pQVar27;
  QStyleOptionSlider *pQVar28;
  Representation RVar29;
  int iVar31;
  long lVar33;
  bool bVar34;
  long in_FS_OFFSET;
  bool bVar35;
  QRect QVar36;
  QRect QVar37;
  int local_1ec;
  Representation local_1c0;
  int local_1a8;
  int local_1a0;
  int local_190;
  undefined1 local_148 [8];
  undefined8 uStack_140;
  undefined1 *local_138;
  QRect local_128;
  undefined1 local_118 [12];
  Representation RStack_10c;
  QRect local_108;
  QStyleOption opt;
  QStyleOptionSlider barOpt;
  Representation RVar30;
  Representation RVar32;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  widget = *(QWidget **)&(this->super_QFramePrivate).super_QWidgetPrivate.field_0x8;
  puVar26 = &DAT_005f73a0;
  pQVar28 = &barOpt;
  for (lVar24 = 0x10; lVar24 != 0; lVar24 = lVar24 + -1) {
    uVar25 = *puVar26;
    (pQVar28->super_QStyleOptionComplex).super_QStyleOption.version = (int)uVar25;
    (pQVar28->super_QStyleOptionComplex).super_QStyleOption.type = (int)((ulong)uVar25 >> 0x20);
    puVar26 = puVar26 + 1;
    pQVar28 = (QStyleOptionSlider *)&(pQVar28->super_QStyleOptionComplex).super_QStyleOption.state;
  }
  QStyleOptionSlider::QStyleOptionSlider(&barOpt);
  (**(code **)(*(long *)&(this->hbar->super_QAbstractSlider).super_QWidget + 0x1a8))
            (this->hbar,&barOpt);
  pQVar20 = QWidget::style((QWidget *)this->hbar);
  iVar10 = (**(code **)(*(long *)pQVar20 + 0xf0))(pQVar20,0x60,&barOpt,this->hbar,0);
  bVar22 = true;
  if (*needHorizontalScrollbar == false) {
    SVar1 = this->hbarpolicy;
    if (SVar1 != ScrollBarAlwaysOff) {
      if (SVar1 == ScrollBarAlwaysOn) {
        bVar22 = true;
        if (iVar10 == 0) goto LAB_0036e819;
      }
      else if (iVar10 == 0 && SVar1 != ScrollBarAsNeeded) goto LAB_0036e811;
      iVar11 = QAbstractSlider::minimum(&this->hbar->super_QAbstractSlider);
      iVar12 = QAbstractSlider::maximum(&this->hbar->super_QAbstractSlider);
      if (iVar11 < iVar12) {
        uVar25 = (**(code **)(*(long *)&(this->hbar->super_QAbstractSlider).super_QWidget + 0x70))()
        ;
        bVar22 = 0 < (int)((ulong)uVar25 >> 0x20) && 0 < (int)uVar25;
        goto LAB_0036e819;
      }
    }
LAB_0036e811:
    bVar22 = false;
  }
LAB_0036e819:
  pQVar20 = QWidget::style((QWidget *)this->hbar);
  iVar11 = (**(code **)(*(long *)pQVar20 + 0xe0))(pQVar20,0x56,&barOpt,this->hbar);
  (**(code **)(*(long *)&(this->vbar->super_QAbstractSlider).super_QWidget + 0x1a8))
            (this->vbar,&barOpt);
  pQVar20 = QWidget::style((QWidget *)this->vbar);
  iVar12 = (**(code **)(*(long *)pQVar20 + 0xf0))(pQVar20,0x60,&barOpt,this->vbar,0);
  if (*needVerticalScrollbar == false) {
    SVar1 = this->vbarpolicy;
    if (SVar1 != ScrollBarAlwaysOff) {
      if (SVar1 == ScrollBarAlwaysOn) {
        bVar34 = true;
        if (iVar12 == 0) goto LAB_0036e904;
      }
      else if (iVar12 == 0 && SVar1 != ScrollBarAsNeeded) goto LAB_0036e901;
      iVar31 = QAbstractSlider::minimum(&this->vbar->super_QAbstractSlider);
      iVar13 = QAbstractSlider::maximum(&this->vbar->super_QAbstractSlider);
      if (iVar31 < iVar13) {
        uVar25 = (**(code **)(*(long *)&(this->vbar->super_QAbstractSlider).super_QWidget + 0x70))()
        ;
        bVar34 = 0 < (int)((ulong)uVar25 >> 0x20) && 0 < (int)uVar25;
        goto LAB_0036e904;
      }
    }
LAB_0036e901:
    bVar34 = false;
  }
  else {
    bVar34 = true;
  }
LAB_0036e904:
  pQVar20 = QWidget::style((QWidget *)this->vbar);
  iVar13 = (**(code **)(*(long *)pQVar20 + 0xe0))(pQVar20,0x56,&barOpt,this->vbar);
  opt.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  opt._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  opt.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOption::QStyleOption(&opt,0,0);
  QStyleOption::initFrom(&opt,widget);
  (**(code **)(*(long *)&(this->hbar->super_QAbstractSlider).super_QWidget + 0x70))();
  iVar14 = (**(code **)(*(long *)&(this->vbar->super_QAbstractSlider).super_QWidget + 0x70))();
  local_108 = QWidget::rect(widget);
  bVar8 = iVar13 == 0 & bVar34;
  iVar31 = 0;
  if (bVar8 != 0) {
    iVar31 = iVar14;
  }
  bVar9 = iVar11 == 0 & bVar22;
  iVar17 = 0;
  if (bVar9 != 0) {
    iVar17 = extraout_var;
  }
  pQVar3 = this->cornerWidget;
  stack0xfffffffffffffef0 = &DAT_aaaaaaaaaaaaaaaa;
  local_118._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  if ((this->super_QFramePrivate).frameStyle == 0) {
LAB_0036eb88:
    _local_148 = QStyle::visualRect(opt.direction,&opt.rect,&local_108);
    QFrame::setFrameRect((QFrame *)widget,(QRect *)local_148);
    QVar37 = QWidget::contentsRect(widget);
    uVar21 = QVar37._0_8_;
    local_1a8 = (int)QVar37.y1.m_i;
    local_118._8_4_ = QVar37.x2.m_i.m_i - iVar31;
    local_190 = QVar37.y2.m_i.m_i - iVar17;
    local_118._0_4_ = (int)uVar21;
    local_118._4_4_ = (int)(uVar21 >> 0x20);
    RStack_10c.m_i = local_190;
    auVar5._8_4_ = local_118._8_4_;
    auVar5._0_8_ = uVar21 & 0xffffffff;
    local_1a0 = local_1a8;
  }
  else {
    pQVar20 = QWidget::style(widget);
    iVar15 = (**(code **)(*(long *)pQVar20 + 0xf0))(pQVar20,0x11,&opt,widget,0);
    QVar37 = local_108;
    if (iVar15 == 0) goto LAB_0036eb88;
    pQVar20 = QWidget::style(widget);
    iVar16 = (**(code **)(*(long *)pQVar20 + 0xe0))(pQVar20,0x55,&opt,widget);
    QVar36 = local_108;
    iVar15 = iVar13 + iVar16;
    if (bVar34 == false) {
      iVar15 = 0;
    }
    iVar16 = iVar16 + iVar11;
    if (bVar22 == false) {
      iVar16 = 0;
    }
    uStack_140._0_4_ = local_108.x2.m_i;
    uStack_140._4_4_ = local_108.y2.m_i;
    uStack_140._0_4_ = uStack_140._0_4_ - (iVar15 + iVar31);
    local_148._0_4_ = local_108.x1.m_i;
    local_148._4_4_ = local_108.y1.m_i;
    uStack_140._4_4_ = uStack_140._4_4_ - (iVar16 + iVar17);
    local_108 = QVar36;
    local_128 = QStyle::visualRect(opt.direction,&opt.rect,(QRect *)local_148);
    QFrame::setFrameRect((QFrame *)widget,&local_128);
    direction = opt.direction;
    local_128 = QWidget::contentsRect(widget);
    _local_118 = QStyle::visualRect(direction,&opt.rect,&local_128);
    auVar5 = local_118;
    local_1a0 = (int)local_118._4_4_;
    local_190 = (int)local_118._12_4_;
    local_1a8 = (int)QVar37.y1.m_i;
  }
  bVar35 = pQVar3 != (QWidget *)0x0;
  iVar17 = 0;
  iVar31 = 0;
  if (bVar34 != false) {
    iVar31 = iVar14;
  }
  if (bVar22 != false) {
    iVar17 = extraout_var;
  }
  if (((bVar9 | bVar8) & bVar35) != 0) {
    iVar17 = extraout_var;
    iVar31 = iVar14;
  }
  RVar32 = QVar37.x2.m_i;
  iVar31 = RVar32.m_i - iVar31;
  RVar23.m_i = iVar31 + 1;
  RVar30 = QVar37.y2.m_i;
  RVar29.m_i = RVar30.m_i - iVar17;
  RVar18.m_i = RVar29.m_i + 1;
  if (((bVar22 & bVar34) == 1) && ((iVar13 == 0 && iVar11 == 0) && pQVar3 == (QWidget *)0x0)) {
    local_148._4_4_ = RVar18.m_i;
    local_148._0_4_ = RVar23.m_i;
    uStack_140._0_4_ = iVar14 + iVar31;
    uStack_140._4_4_ = extraout_var + RVar29.m_i;
    QVar36 = QStyle::visualRect(opt.direction,&opt.rect,(QRect *)local_148);
    this->cornerPaintingRect = QVar36;
  }
  else {
    (this->cornerPaintingRect).x1 = 0;
    (this->cornerPaintingRect).y1 = 0;
    (this->cornerPaintingRect).x2 = -1;
    (this->cornerPaintingRect).y2 = -1;
  }
  if ((bVar34 & 0 < iVar13) == 0) {
    local_1ec = 0;
    iVar13 = 0;
    if ((0 < iVar11 & bVar22) == 0) goto LAB_0036eead;
  }
  local_138 = &DAT_aaaaaaaaaaaaaaaa;
  uStack_140 = (QHeaderView **)&DAT_aaaaaaaaaaaaaaaa;
  local_148 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  QObject::findChildren<QHeaderView*>
            ((QList<QHeaderView_*> *)local_148,&widget->super_QObject,(FindChildOptions)0x1);
  local_1ec = 0;
  iVar13 = 0;
  if (local_138 < (undefined1 *)0x3) {
    ppQVar6 = uStack_140;
    lVar33 = (long)local_138 << 3;
    local_1ec = 0;
    uVar25 = 0;
    for (lVar24 = 0; iVar13 = (int)uVar25, lVar33 != lVar24; lVar24 = lVar24 + 8) {
      this_00 = *(QHeaderView **)((long)ppQVar6 + lVar24);
      local_128 = ((this_00->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                   super_QWidget.data)->crect;
      OVar19 = QHeaderView::orientation(this_00);
      if ((OVar19 == Vertical) &&
         ((((this_00->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
           data)->widget_attributes & 0x8000) != 0)) {
        QVar36 = QStyle::visualRect(opt.direction,&opt.rect,&local_128);
        if (((opt.rect.x2.m_i - opt.rect.x1.m_i) + 1) / 2 < QVar36.x1.m_i.m_i) goto LAB_0036ee25;
        QVar36 = QStyle::visualRect(opt.direction,&opt.rect,&local_128);
        uVar25 = QVar36._8_8_;
      }
      else {
LAB_0036ee25:
        OVar19 = QHeaderView::orientation(this_00);
        if ((OVar19 == Horizontal) &&
           ((((this_00->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
              super_QWidget.data)->widget_attributes & 0x8000) != 0)) {
          RVar7.m_i = local_128.y1.m_i;
          iVar11 = QFrame::frameWidth((QFrame *)widget);
          if (RVar7.m_i <= iVar11) {
            local_1ec = local_128.y2.m_i;
          }
        }
      }
    }
  }
  QArrayDataPointer<QHeaderView_*>::~QArrayDataPointer
            ((QArrayDataPointer<QHeaderView_*> *)local_148);
LAB_0036eead:
  if (bVar22 != false) {
    local_1c0 = QVar37.x1.m_i;
    local_148._4_4_ = RVar18.m_i;
    local_148._0_4_ = iVar13 + local_1c0.m_i;
    uStack_140._0_4_ = iVar31;
    if (iVar10 != 0 && !bVar35) {
      uStack_140._0_4_ = RVar32.m_i;
    }
    uStack_140._4_4_ = RVar30.m_i;
    local_148._0_4_ = local_148._0_4_;
    local_148._4_4_ = local_148._4_4_;
    uStack_140._0_4_ = local_148._8_4_;
    pQVar4 = (this->scrollBarContainers).m_data[0];
    local_128 = QStyle::visualRect(opt.direction,&opt.rect,(QRect *)local_148);
    pQVar27 = &local_128;
    QWidget::setGeometry(&pQVar4->super_QWidget,pQVar27);
    QWidget::raise(&(this->scrollBarContainers).m_data[0]->super_QWidget,(int)pQVar27);
  }
  if (bVar34 != false) {
    local_148._4_4_ = local_1ec + local_1a8;
    local_148._0_4_ = RVar23.m_i;
    uStack_140._0_4_ = RVar32.m_i;
    uStack_140._4_4_ = RVar29.m_i;
    if (iVar12 != 0 && !bVar35) {
      uStack_140._4_4_ = RVar30.m_i;
    }
    pQVar4 = (this->scrollBarContainers).m_data[1];
    local_128 = QStyle::visualRect(opt.direction,&opt.rect,(QRect *)local_148);
    pQVar27 = &local_128;
    QWidget::setGeometry(&pQVar4->super_QWidget,pQVar27);
    QWidget::raise(&(this->scrollBarContainers).m_data[1]->super_QWidget,(int)pQVar27);
  }
  pQVar3 = this->cornerWidget;
  if (pQVar3 != (QWidget *)0x0) {
    local_148._4_4_ = RVar18.m_i;
    local_148._0_4_ = RVar23.m_i;
    uStack_140._0_4_ = RVar32.m_i;
    uStack_140._4_4_ = RVar30.m_i;
    local_128 = QStyle::visualRect(opt.direction,&opt.rect,(QRect *)local_148);
    QWidget::setGeometry(pQVar3,&local_128);
  }
  pQVar4 = (this->scrollBarContainers).m_data[0];
  (**(code **)(*(long *)&pQVar4->super_QWidget + 0x68))(pQVar4,bVar22);
  pQVar4 = (this->scrollBarContainers).m_data[1];
  (**(code **)(*(long *)&pQVar4->super_QWidget + 0x68))(pQVar4,bVar34);
  bVar35 = QWidget::isRightToLeft(widget);
  local_118._4_4_ = local_1a0 + this->top;
  local_118._0_4_ =
       auVar5._0_4_ +
       ((Representation *)(&this->scrollBarContainers + 5))[(ulong)bVar35 * 2 + 2].m_i;
  local_118._8_4_ =
       auVar5._8_4_ -
       ((Representation *)(&this->scrollBarContainers + 5))[(ulong)!bVar35 * 2 + 2].m_i;
  RStack_10c.m_i = local_190 - this->bottom;
  QVar37 = QStyle::visualRect(opt.direction,&opt.rect,(QRect *)local_118);
  iVar10 = (this->overshoot).xp.m_i;
  iVar11 = (this->overshoot).yp.m_i;
  local_118._4_4_ = QVar37.y1.m_i.m_i - iVar11;
  local_118._0_4_ = QVar37.x1.m_i.m_i - iVar10;
  local_118._8_4_ = QVar37.x2.m_i.m_i - iVar10;
  RStack_10c.m_i = QVar37.y2.m_i.m_i - iVar11;
  QWidget::setGeometry(this->viewport,(QRect *)local_118);
  *needHorizontalScrollbar = bVar22;
  *needVerticalScrollbar = bVar34;
  QStyleOption::~QStyleOption(&opt);
  QStyleOption::~QStyleOption((QStyleOption *)&barOpt);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractScrollAreaPrivate::layoutChildren_helper(bool *needHorizontalScrollbar, bool *needVerticalScrollbar)
{
    Q_Q(QAbstractScrollArea);
    QStyleOptionSlider barOpt;

    hbar->initStyleOption(&barOpt);
    bool htransient = hbar->style()->styleHint(QStyle::SH_ScrollBar_Transient, &barOpt, hbar);
    bool needh = *needHorizontalScrollbar || ((hbarpolicy != Qt::ScrollBarAlwaysOff) && ((hbarpolicy == Qt::ScrollBarAlwaysOn && !htransient)
                            || ((hbarpolicy == Qt::ScrollBarAsNeeded || htransient)
                            && hbar->minimum() < hbar->maximum() && !hbar->sizeHint().isEmpty())));
    const int hscrollOverlap = hbar->style()->pixelMetric(QStyle::PM_ScrollView_ScrollBarOverlap, &barOpt, hbar);

    vbar->initStyleOption(&barOpt);
    bool vtransient = vbar->style()->styleHint(QStyle::SH_ScrollBar_Transient, &barOpt, vbar);
    bool needv = *needVerticalScrollbar || ((vbarpolicy != Qt::ScrollBarAlwaysOff) && ((vbarpolicy == Qt::ScrollBarAlwaysOn && !vtransient)
                            || ((vbarpolicy == Qt::ScrollBarAsNeeded || vtransient)
                            && vbar->minimum() < vbar->maximum() && !vbar->sizeHint().isEmpty())));
    const int vscrollOverlap = vbar->style()->pixelMetric(QStyle::PM_ScrollView_ScrollBarOverlap, &barOpt, vbar);

    QStyleOption opt(0);
    opt.initFrom(q);

    const int hsbExt = hbar->sizeHint().height();
    const int vsbExt = vbar->sizeHint().width();
    const QPoint extPoint(vsbExt, hsbExt);
    const QSize extSize(vsbExt, hsbExt);

    const QRect widgetRect = q->rect();

    const bool hasCornerWidget = (cornerWidget != nullptr);

    QPoint cornerOffset((needv && vscrollOverlap == 0) ? vsbExt : 0, (needh && hscrollOverlap == 0) ? hsbExt : 0);
    QRect controlsRect;
    QRect viewportRect;

    // In FrameOnlyAroundContents mode the frame is drawn between the controls and
    // the viewport, else the frame rect is equal to the widget rect.
    if ((frameStyle != QFrame::NoFrame) &&
        q->style()->styleHint(QStyle::SH_ScrollView_FrameOnlyAroundContents, &opt, q)) {
        controlsRect = widgetRect;
        const int spacing = q->style()->pixelMetric(QStyle::PM_ScrollView_ScrollBarSpacing, &opt, q);
        const QPoint cornerExtra(needv ? spacing + vscrollOverlap : 0, needh ? spacing + hscrollOverlap : 0);
        QRect frameRect = widgetRect;
        frameRect.adjust(0, 0, -cornerOffset.x() - cornerExtra.x(), -cornerOffset.y() - cornerExtra.y());
        q->setFrameRect(QStyle::visualRect(opt.direction, opt.rect, frameRect));
        // The frame rect needs to be in logical coords, however we need to flip
        // the contentsRect back before passing it on to the viewportRect
        // since the viewportRect has its logical coords calculated later.
        viewportRect = QStyle::visualRect(opt.direction, opt.rect, q->contentsRect());
    } else {
        q->setFrameRect(QStyle::visualRect(opt.direction, opt.rect, widgetRect));
        controlsRect = q->contentsRect();
        viewportRect = QRect(controlsRect.topLeft(), controlsRect.bottomRight() - cornerOffset);
    }

    cornerOffset = QPoint(needv ? vsbExt : 0, needh ? hsbExt : 0);

    // If we have a corner widget and are only showing one scroll bar, we need to move it
    // to make room for the corner widget.
    if (hasCornerWidget && ((needv && vscrollOverlap == 0) || (needh && hscrollOverlap == 0)))
        cornerOffset =  extPoint;

    // The corner point is where the scroll bar rects, the corner widget rect and the
    // viewport rect meets.
    const QPoint cornerPoint(controlsRect.bottomRight() + QPoint(1, 1) - cornerOffset);

    // Some styles paints the corner if both scorllbars are showing and there is
    // no corner widget.
    if (needv && needh && !hasCornerWidget && hscrollOverlap == 0 && vscrollOverlap == 0)
        cornerPaintingRect = QStyle::visualRect(opt.direction, opt.rect, QRect(cornerPoint, extSize));
    else
        cornerPaintingRect = QRect();

    // move the scrollbars away from top/left headers
    int vHeaderRight = 0;
    int hHeaderBottom = 0;
#if QT_CONFIG(itemviews)
    if ((vscrollOverlap > 0 && needv) || (hscrollOverlap > 0 && needh)) {
        const QList<QHeaderView *> headers = q->findChildren<QHeaderView*>();
        if (headers.size() <= 2) {
            for (const QHeaderView *header : headers) {
                const QRect geo = header->geometry();
                if (header->orientation() == Qt::Vertical && header->isVisible() && QStyle::visualRect(opt.direction, opt.rect, geo).left() <= opt.rect.width() / 2)
                    vHeaderRight = QStyle::visualRect(opt.direction, opt.rect, geo).right();
                else if (header->orientation() == Qt::Horizontal && header->isVisible() && geo.top() <= q->frameWidth())
                    hHeaderBottom = geo.bottom();
             }
         }
    }
#endif // QT_CONFIG(itemviews)
    if (needh) {
        QRect horizontalScrollBarRect(QPoint(controlsRect.left() + vHeaderRight, cornerPoint.y()), QPoint(cornerPoint.x() - 1, controlsRect.bottom()));

        if (!hasCornerWidget && htransient)
            horizontalScrollBarRect.adjust(0, 0, cornerOffset.x(), 0);
        scrollBarContainers[Qt::Horizontal]->setGeometry(QStyle::visualRect(opt.direction, opt.rect, horizontalScrollBarRect));
        scrollBarContainers[Qt::Horizontal]->raise();
    }

    if (needv) {
        QRect verticalScrollBarRect  (QPoint(cornerPoint.x(), controlsRect.top() + hHeaderBottom),  QPoint(controlsRect.right(), cornerPoint.y() - 1));
        if (!hasCornerWidget && vtransient)
            verticalScrollBarRect.adjust(0, 0, 0, cornerOffset.y());
        scrollBarContainers[Qt::Vertical]->setGeometry(QStyle::visualRect(opt.direction, opt.rect, verticalScrollBarRect));
        scrollBarContainers[Qt::Vertical]->raise();
    }

    if (cornerWidget) {
        const QRect cornerWidgetRect(cornerPoint, controlsRect.bottomRight());
        cornerWidget->setGeometry(QStyle::visualRect(opt.direction, opt.rect, cornerWidgetRect));
    }

    scrollBarContainers[Qt::Horizontal]->setVisible(needh);
    scrollBarContainers[Qt::Vertical]->setVisible(needv);

    if (q->isRightToLeft())
        viewportRect.adjust(right, top, -left, -bottom);
    else
        viewportRect.adjust(left, top, -right, -bottom);
    viewportRect = QStyle::visualRect(opt.direction, opt.rect, viewportRect);
    viewportRect.translate(-overshoot);
    viewport->setGeometry(viewportRect); // resize the viewport last

    *needHorizontalScrollbar = needh;
    *needVerticalScrollbar = needv;
}